

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O3

void ddb_h1(long ndims,Integer *ardims,long npes,double threshold,Integer *blk,Integer *pedims)

{
  undefined8 uVar1;
  double dVar2;
  undefined8 uVar3;
  double *ardims_00;
  long lVar4;
  double *qedims;
  long *pdivs;
  void *__dest;
  long lVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  size_t __nmemb;
  long k;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ulong uVar26;
  undefined1 auVar27 [16];
  double local_58;
  size_t local_50;
  
  if (ndims == 1) {
    *pedims = npes;
    lVar4 = 1;
    if (1 < *ardims / npes) {
      lVar4 = *ardims / npes;
    }
    *blk = lVar4;
    return;
  }
  ardims_00 = (double *)calloc(ndims,8);
  if (ardims_00 == (double *)0x0) {
    ddb_h1_cold_1();
    return;
  }
  if (0 < ndims) {
    lVar4 = 0;
    do {
      if (blk[lVar4] < 1) {
        blk[lVar4] = 1;
      }
      lVar4 = lVar4 + 1;
    } while (ndims != lVar4);
    if (0 < ndims) {
      lVar4 = 0;
      do {
        ardims_00[lVar4] = (double)(ardims[lVar4] / blk[lVar4]);
        lVar4 = lVar4 + 1;
      } while (ndims != lVar4);
      if (0 < ndims) {
        lVar4 = 0;
        do {
          if ((long)ardims_00[lVar4] < 1) {
            ardims_00[lVar4] = 4.94065645841247e-324;
            blk[lVar4] = ardims[lVar4];
          }
          lVar4 = lVar4 + 1;
        } while (ndims != lVar4);
      }
    }
  }
  qedims = (double *)calloc(ndims,8);
  if (qedims == (double *)0x0) {
    pcVar7 = "ddb_h1";
  }
  else {
    dVar11 = (double)npes;
    if (1 < ndims) {
      lVar4 = 1;
      do {
        dVar11 = dVar11 / ((double)(long)ardims_00[lVar4] / (double)(long)*ardims_00);
        lVar4 = lVar4 + 1;
      } while (ndims != lVar4);
    }
    local_58 = 1.0;
    dVar11 = pow(dVar11,1.0 / (double)ndims);
    *qedims = dVar11;
    if (1 < ndims) {
      dVar15 = *ardims_00;
      lVar4 = 1;
      do {
        qedims[lVar4] = ((double)(long)ardims_00[lVar4] / (double)(long)dVar15) * dVar11;
        lVar4 = lVar4 + 1;
      } while (ndims != lVar4);
    }
    __nmemb = 1;
    if (1 < npes) {
      lVar4 = npes + -2;
      auVar12._8_4_ = (int)lVar4;
      auVar12._0_8_ = lVar4;
      auVar12._12_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar23 = ZEXT416(1);
      uVar8 = 0;
      auVar12 = auVar12 ^ _DAT_001b3e10;
      do {
        auVar16._8_4_ = (int)uVar8;
        auVar16._0_8_ = uVar8;
        auVar16._12_4_ = (int)(uVar8 >> 0x20);
        auVar17 = (auVar16 | _DAT_001b3e30) ^ _DAT_001b3e10;
        auVar21._0_4_ = -(uint)(auVar12._0_4_ < auVar17._0_4_);
        auVar21._4_4_ = -(uint)(auVar12._4_4_ < auVar17._4_4_);
        auVar21._8_4_ = -(uint)(auVar12._8_4_ < auVar17._8_4_);
        auVar21._12_4_ = -(uint)(auVar12._12_4_ < auVar17._12_4_);
        auVar18._4_4_ = -(uint)(auVar17._4_4_ == auVar12._4_4_);
        auVar18._12_4_ = -(uint)(auVar17._12_4_ == auVar12._12_4_);
        auVar18._0_4_ = auVar18._4_4_;
        auVar18._8_4_ = auVar18._12_4_;
        auVar17._4_4_ = auVar21._4_4_;
        auVar17._0_4_ = auVar21._4_4_;
        auVar17._8_4_ = auVar21._12_4_;
        auVar17._12_4_ = auVar21._12_4_;
        auVar17 = auVar18 & auVar21 | auVar17;
        auVar24 = auVar23;
        if ((~auVar17._0_4_ & 1) != 0) {
          auVar24._8_8_ = 0;
          auVar24._0_8_ = (ulong)npes % (uVar8 + 2);
        }
        if (((auVar17._8_2_ ^ 0xffff) & 1) != 0) {
          auVar24._8_8_ = (ulong)npes % (uVar8 + 3);
        }
        auVar25._0_4_ = -(uint)(auVar24._0_4_ == 0);
        auVar25._4_4_ = -(uint)(auVar24._4_4_ == 0);
        auVar25._8_4_ = -(uint)(auVar24._8_4_ == 0);
        auVar25._12_4_ = -(uint)(auVar24._12_4_ == 0);
        auVar27._4_4_ = auVar25._0_4_;
        auVar27._0_4_ = auVar25._4_4_;
        auVar27._8_4_ = auVar25._12_4_;
        auVar27._12_4_ = auVar25._8_4_;
        uVar22 = auVar23._0_8_;
        uVar26 = auVar23._8_8_;
        auVar23._0_8_ = uVar22 - SUB168(auVar27 & auVar25,0);
        auVar23._8_8_ = uVar26 - SUB168(auVar27 & auVar25,8);
        uVar8 = uVar8 + 2;
      } while ((npes & 0x7ffffffffffffffeU) != uVar8);
      auVar13._4_4_ = auVar21._0_4_;
      auVar13._0_4_ = auVar21._0_4_;
      auVar13._8_4_ = auVar21._8_4_;
      auVar13._12_4_ = auVar21._8_4_;
      auVar19._4_4_ = auVar21._4_4_;
      auVar19._0_4_ = auVar21._4_4_;
      auVar19._8_4_ = auVar21._12_4_;
      auVar19._12_4_ = auVar21._12_4_;
      auVar19 = auVar18 & auVar13 | auVar19;
      auVar20._0_8_ = uVar22 & auVar19._0_8_;
      auVar20._8_8_ = uVar26 & auVar19._8_8_;
      auVar20 = ~auVar19 & auVar23 | auVar20;
      __nmemb = auVar20._8_8_ + auVar20._0_8_;
    }
    pdivs = (long *)calloc(__nmemb,8);
    if (pdivs == (long *)0x0) {
      fprintf(_stderr,"%s: %s\n","split","memory allocation failed");
      if (0 < ndims) {
        memset(blk,0,ndims << 3);
      }
      free(ardims_00);
      ardims_00 = qedims;
      goto LAB_0019a637;
    }
    if (0 < npes) {
      lVar4 = 0;
      uVar8 = 1;
      do {
        if ((ulong)npes % uVar8 == 0) {
          pdivs[lVar4] = uVar8;
          lVar4 = lVar4 + 1;
        }
        bVar10 = uVar8 != npes;
        uVar8 = uVar8 + 1;
      } while (bVar10);
    }
    ddb_ap(ndims,qedims,(Integer *)ardims_00,pedims,npes,__nmemb,pdivs);
    free(qedims);
    free(pdivs);
    __dest = calloc(ndims,8);
    if (__dest != (void *)0x0) {
      if (0 < ndims) {
        local_58 = 1.0;
        lVar4 = 0;
        do {
          dVar11 = ardims_00[lVar4];
          local_58 = local_58 *
                     ((double)((long)dVar11 - (long)dVar11 % pedims[lVar4]) / (double)(long)dVar11);
          lVar4 = lVar4 + 1;
        } while (ndims != lVar4);
        if (0 < ndims) {
          memcpy(__dest,pedims,ndims * 8);
        }
      }
      local_50 = ndims * 8;
      dVar11 = *ardims_00;
      do {
        if (0 < ndims) {
          memcpy(pedims,__dest,local_50);
        }
        lVar4 = *pedims;
        lVar6 = lVar4;
        if (lVar4 <= (long)dVar11) {
          lVar6 = (long)dVar11 % lVar4;
        }
        if (ndims < 2) {
          lVar9 = 0;
        }
        else {
          lVar5 = 1;
          lVar9 = 0;
          dVar15 = (double)lVar6 / (double)lVar4;
          do {
            lVar4 = pedims[lVar5];
            lVar6 = lVar4;
            if (lVar4 <= (long)ardims_00[lVar5]) {
              lVar6 = (long)ardims_00[lVar5] % lVar4;
            }
            dVar14 = (double)lVar6 / (double)lVar4;
            lVar4 = lVar5;
            if (dVar14 <= dVar15) {
              dVar14 = dVar15;
              lVar4 = lVar9;
            }
            lVar9 = lVar4;
            lVar5 = lVar5 + 1;
            dVar15 = dVar14;
          } while (ndims != lVar5);
        }
        if (ndims < 1) goto LAB_0019a515;
        lVar6 = 0;
        lVar4 = lVar9;
        dVar15 = local_58;
        do {
          dVar14 = dVar15;
          if (lVar6 != lVar9) {
            uVar1 = *(undefined8 *)((long)__dest + lVar9 * 8);
            *(undefined8 *)((long)__dest + lVar9 * 8) = *(undefined8 *)((long)__dest + lVar6 * 8);
            *(undefined8 *)((long)__dest + lVar6 * 8) = uVar1;
            lVar5 = 0;
            dVar14 = 1.0;
            do {
              dVar2 = ardims_00[lVar5];
              dVar14 = dVar14 * ((double)((long)dVar2 -
                                         (long)dVar2 % *(long *)((long)__dest + lVar5 * 8)) /
                                (double)(long)dVar2);
              lVar5 = lVar5 + 1;
            } while (ndims != lVar5);
            lVar5 = lVar6;
            if (dVar14 <= dVar15) {
              dVar14 = dVar15;
              lVar5 = lVar4;
            }
            lVar4 = lVar5;
            uVar3 = *(undefined8 *)((long)__dest + lVar9 * 8);
            *(undefined8 *)((long)__dest + lVar9 * 8) = uVar1;
            *(undefined8 *)((long)__dest + lVar6 * 8) = uVar3;
          }
          lVar6 = lVar6 + 1;
          dVar15 = dVar14;
        } while (lVar6 != ndims);
        if (lVar4 != lVar9) {
          uVar1 = *(undefined8 *)((long)__dest + lVar9 * 8);
          *(undefined8 *)((long)__dest + lVar9 * 8) = *(undefined8 *)((long)__dest + lVar4 * 8);
          *(undefined8 *)((long)__dest + lVar4 * 8) = uVar1;
        }
        bVar10 = local_58 < dVar14;
        local_58 = dVar14;
      } while (bVar10);
      if (0 < ndims) {
        memcpy(pedims,__dest,local_50);
      }
LAB_0019a515:
      free(__dest);
      if (local_58 < threshold) {
        ddb_ex(ndims,(Integer *)ardims_00,npes,threshold,blk,pedims);
      }
      free(ardims_00);
      if (ndims < 1) {
        return;
      }
      lVar4 = 0;
      do {
        lVar6 = ardims[lVar4] / pedims[lVar4];
        if (lVar6 < 2) {
          lVar6 = 1;
        }
        blk[lVar4] = lVar6;
        lVar4 = lVar4 + 1;
      } while (ndims != lVar4);
      return;
    }
    pcVar7 = "split";
  }
  fprintf(_stderr,"%s: %s\n",pcVar7,"memory allocation failed");
  if (0 < ndims) {
    memset(blk,0,ndims << 3);
  }
LAB_0019a637:
  free(ardims_00);
  return;
}

Assistant:

void ddb_h1(long ndims, Integer ardims[], long npes, double threshold,
           Integer blk[], Integer pedims[])
      {
      long h, i, j, k;
      double * qedims;
      long * pdivs;
      Integer * apdims;
	  Integer *tard;
      long npdivs;
      double t, q;
      double cb, ub, blb;
      if(ndims==1) {
         pedims[0] = npes;
         blb = dd_ev(ndims,ardims,pedims);
         dd_su(ndims,ardims,pedims,blk);
         return;
      }

      /*- Allocate memory to store the granularity -*/
      tard = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tard==NULL){
         fprintf(stderr,"%s: %s\n","ddb_h1",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }
      /*- Reset array dimensions to reflect granularity -*/
      for(i=0;i<ndims;i++) if (blk[i]<1) blk[i] = 1;
      for(i=0;i<ndims;i++) tard[i] = ardims[i] / blk[i];
      for(i=0;i<ndims;i++) if (tard[i]<1) {
         tard[i] = 1; blk[i] = ardims[i];}

      /*- First solve the load balancing problem exactly in
       *- floating point arithmetic -*/
      qedims = (double *) calloc((size_t)ndims,sizeof(double));
      if(qedims==NULL){
         fprintf(stderr,"%s: %s\n","ddb_h1",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }

      qedims[0] = (double) npes;
      for(i=1;i<ndims;i++) qedims[0] /= (tard[i]/(double)tard[0]);
      qedims[0] = pow(qedims[0],1.0/ndims);

      for(i=1;i<ndims;i++){
          qedims[i] = (tard[i]/(double)tard[0])*qedims[0];
      };

      /*- Set up the search for a integer approximation the floating point solution -*/
      npdivs = 1;
      for(i=2;i<=npes;i++) if(npes%i==0) npdivs += 1;
      pdivs = (long *) calloc((size_t)npdivs,sizeof(long));
      if(pdivs==NULL){
         fprintf(stderr,"%s: %s\n","split",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         free(qedims);
         return;
      }
      /*- Compute the discrete approximation -*/
      for(j=0,i=1;i<=npes;i++) if(npes%i==0) pdivs[j++] = i;
      ddb_ap(ndims,qedims,tard,pedims,npes,npdivs,pdivs) ; 
      free(qedims);
      free(pdivs);


      /*- Lookout for a permutation of the solution vector
       *- that would improve the initial solution -*/
      apdims = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(apdims==NULL){
         fprintf(stderr,"%s: %s\n","split",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }

      ub = dd_ev(ndims,tard,pedims);
      for(k=0;k<ndims;k++) apdims[k] = pedims[k];

      do {
         for(k=0;k<ndims;k++) pedims[k] = apdims[k];
         blb = ub;

         /*- Find the worst distributed dimension -*/
         h = 0;
         q = (tard[0]<pedims[0]) ? pedims[0] : tard[0]%pedims[0];
         q /= (double)pedims[0];
         for(k=1;k<ndims;k++){
            t = (tard[k]<pedims[k]) ? pedims[k] : tard[k]%pedims[k];
            t /= (double) pedims[k];
            if(t>q) {
              h = k; q = t;
            }
         }

         /*- Swap elements of apdims to improve load balance */
         j = h;
         for(k=0;k<ndims;k++){
            if(k==h) continue;
            i = apdims[h]; apdims[h] = apdims[k]; apdims[k] = i;
            cb = dd_ev(ndims,tard,apdims);
            if(cb>ub) {
              j = k;
              ub = cb;
            }
            i = apdims[h]; apdims[h] = apdims[k]; apdims[k] = i;
         }
         if(j!=h){
            i = apdims[h]; apdims[h] = apdims[j]; apdims[j] = i;
         }
      } while (ub > blb);

      for(i=0;i<ndims;i++) pedims[i] = apdims[i];
      blb = ub;
      free(apdims);

      /*- Do an exhaustive search is the heuristic returns a solution 
       *- whose load balance ratio is less than the given threshold. -*/
      if(blb<threshold) ddb_ex(ndims,tard,npes,threshold,blk,pedims);

      free(tard);

      dd_su(ndims,ardims,pedims,blk);

      return;
      }